

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcProductRepresentation::~IfcProductRepresentation
          (IfcProductRepresentation *this)

{
  ~IfcProductRepresentation
            ((IfcProductRepresentation *)
             ((long)&(this->
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>).
                     _vptr_ObjectHelper +
             (long)(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductRepresentation,_3UL>
                   )._vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcProductRepresentation() : Object("IfcProductRepresentation") {}